

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O2

int run_test_tcp_bind6_localhost_ok(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in6 addr;
  uv_tcp_t server;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  iVar1 = uv_ip6_addr("::1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,(sockaddr *)&addr,0);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uVar3 = 0xae;
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xac;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0xaa;
    }
  }
  else {
    pcVar4 = "0 == uv_ip6_addr(\"::1\", TEST_PORT, &addr)";
    uVar3 = 0xa7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind6_localhost_ok) {
  struct sockaddr_in6 addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}